

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool ReadV1_TCODE_ANNOTATION_Helper(ON_BinaryArchive *archive,char *buffer,ON_wString *tc)

{
  bool bVar1;
  int iVar2;
  size_t sz;
  ON_wString *pOStack_30;
  int j;
  char *cp;
  ON_wString *tc_local;
  char *buffer_local;
  ON_BinaryArchive *archive_local;
  
  pOStack_30 = (ON_wString *)0x0;
  sz._4_4_ = 0;
  cp = (char *)tc;
  tc_local = (ON_wString *)buffer;
  buffer_local = (char *)archive;
  bVar1 = ON_BinaryArchive::ReadInt(archive,(ON__INT32 *)((long)&sz + 4));
  if (bVar1) {
    iVar2 = sz._4_4_ + 1;
    if ((sz._4_4_ < 0x80) && (tc_local != (ON_wString *)0x0)) {
      pOStack_30 = tc_local;
    }
    else {
      pOStack_30 = (ON_wString *)onmalloc((long)iVar2);
      if (pOStack_30 == (ON_wString *)0x0) {
        return false;
      }
    }
    memset(pOStack_30,0,(long)iVar2);
    bVar1 = ON_BinaryArchive::ReadChar
                      ((ON_BinaryArchive *)buffer_local,(long)sz._4_4_,(char *)pOStack_30);
    if (bVar1) {
      *(char *)((long)&pOStack_30->m_s + (long)sz._4_4_) = '\0';
      ON_wString::operator=((ON_wString *)cp,(char *)pOStack_30);
      if (pOStack_30 != tc_local) {
        onfree(pOStack_30);
      }
      archive_local._7_1_ = true;
    }
    else {
      if (pOStack_30 != tc_local) {
        onfree(pOStack_30);
      }
      archive_local._7_1_ = false;
    }
  }
  else {
    archive_local._7_1_ = false;
  }
  return archive_local._7_1_;
}

Assistant:

static bool ReadV1_TCODE_ANNOTATION_Helper( ON_BinaryArchive& archive, char* buffer, ON_wString& tc )
{
  char* cp = 0;
  int j = 0;
  if( !archive.ReadInt( &j))
    return false;
  size_t sz = (j+1)*sizeof(cp[0]);
  if( j > BUFLEN - 1 || !buffer )
  {
    cp = (char*)onmalloc( sz );
    if( !cp)
      return false;
  }
  else
  {
    cp = buffer;
  }

  memset( cp, 0, sz );
  if( !archive.ReadChar( j,  cp))
  {
    if ( cp != buffer )
      onfree(cp);
    return false;
  }

  cp[j] = 0;
  tc = cp;
  if ( cp != buffer )
    onfree( cp );
  return true;
}